

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_cast.cpp
# Opt level: O2

string_t duckdb::StringCastTZ::Operation<duckdb::dtime_tz_t>(dtime_tz_t input,Vector *vector)

{
  Vector *pVVar1;
  uint uVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  idx_t length;
  Vector *pVVar6;
  Vector *pVVar7;
  ushort uVar8;
  long lVar9;
  long lVar10;
  Vector *vector_00;
  uint uVar11;
  uint uVar12;
  char *data;
  int32_t time [4];
  char micro_buffer [10];
  string_t result;
  
  Time::Convert((dtime_t)(input.bits >> 0x18),time,time + 1,time + 2,time + 3);
  micro_buffer[8] = '\0';
  micro_buffer[9] = '\0';
  micro_buffer[0] = '\0';
  micro_buffer[1] = '\0';
  micro_buffer[2] = '\0';
  micro_buffer[3] = '\0';
  micro_buffer[4] = '\0';
  micro_buffer[5] = '\0';
  micro_buffer[6] = '\0';
  micro_buffer[7] = '\0';
  length = TimeToStringCast::MicrosLength(time[3],micro_buffer);
  uVar12 = (uint)input.bits & 0xffffff;
  uVar4 = 0xe0ff - uVar12;
  lVar9 = length + 1;
  uVar2 = -uVar4;
  if (0 < (int)uVar4) {
    uVar2 = uVar4;
  }
  uVar4 = uVar2 / 0xe10;
  if (uVar2 < 360000) {
    lVar10 = 2;
  }
  else {
    iVar5 = NumericHelper::UnsignedLength<unsigned_int>(uVar4);
    lVar10 = (long)iVar5;
  }
  pVVar6 = (Vector *)(lVar9 + lVar10);
  uVar11 = (uint)((ulong)uVar2 % 0xe10);
  pVVar1 = (Vector *)(lVar10 + 3 + lVar9);
  pVVar7 = pVVar1;
  if (uVar11 < 0x3c) {
    pVVar7 = pVVar6;
  }
  uVar3 = (ushort)((ulong)uVar2 % 0xe10);
  uVar8 = uVar3 % 0x3c;
  vector_00 = (Vector *)&pVVar7->field_0x3;
  if (uVar8 == 0) {
    vector_00 = pVVar7;
  }
  result = StringVector::EmptyString((StringVector *)vector,vector_00,(ulong)uVar8);
  data = result.value._8_8_;
  if (result.value._0_4_ < 0xd) {
    data = result.value.pointer.prefix;
  }
  TimeToStringCast::Format(data,length,time,micro_buffer);
  data[length] = (0xe0ff < uVar12) * '\x02' + '+';
  if (uVar2 < 360000) {
    TimeToStringCast::FormatTwoDigits(data + lVar9,uVar4);
  }
  else {
    NumericHelper::FormatUnsigned<int>(uVar4,data + lVar9 + lVar10);
  }
  if (0x3b < uVar11) {
    data[(long)pVVar6] = ':';
    TimeToStringCast::FormatTwoDigits(data + (long)pVVar6 + 1,(uint)(uVar3 / 0x3c));
    pVVar6 = pVVar1;
  }
  if (uVar8 != 0) {
    data[(long)pVVar6] = ':';
    TimeToStringCast::FormatTwoDigits(data + (long)pVVar6 + 1,(uint)uVar8);
  }
  string_t::Finalize(&result);
  return (string_t)result.value;
}

Assistant:

string_t StringCastTZ::Operation(dtime_tz_t input, Vector &vector) {
	int32_t time[4];
	Time::Convert(input.time(), time[0], time[1], time[2], time[3]);

	char micro_buffer[10] = {};
	const auto time_length = TimeToStringCast::Length(time, micro_buffer);
	idx_t length = time_length;

	const auto offset = input.offset();
	const bool negative = (offset < 0);
	++length;

	auto ss = std::abs(offset);
	const auto hh = ss / Interval::SECS_PER_HOUR;

	const auto hh_length = UnsafeNumericCast<idx_t>((hh < 100) ? 2 : NumericHelper::UnsignedLength(uint32_t(hh)));
	length += hh_length;

	ss %= Interval::SECS_PER_HOUR;
	const auto mm = ss / Interval::SECS_PER_MINUTE;
	if (mm) {
		length += 3;
	}

	ss %= Interval::SECS_PER_MINUTE;
	if (ss) {
		length += 3;
	}

	string_t result = StringVector::EmptyString(vector, length);
	auto data = result.GetDataWriteable();

	idx_t pos = 0;
	TimeToStringCast::Format(data + pos, time_length, time, micro_buffer);
	pos += time_length;

	data[pos++] = negative ? '-' : '+';
	if (hh < 100) {
		TimeToStringCast::FormatTwoDigits(data + pos, hh);
	} else {
		NumericHelper::FormatUnsigned(hh, data + pos + hh_length);
	}
	pos += hh_length;

	if (mm) {
		data[pos++] = ':';
		TimeToStringCast::FormatTwoDigits(data + pos, mm);
		pos += 2;
	}

	if (ss) {
		data[pos++] = ':';
		TimeToStringCast::FormatTwoDigits(data + pos, ss);
		pos += 2;
	}

	result.Finalize();
	return result;
}